

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

Transform * pbrt::LookAt(Transform *__return_storage_ptr__,Point3f *pos,Point3f *look,Vector3f *up)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  SquareMatrix<4> *pSVar8;
  undefined1 auVar17 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar19 [60];
  undefined1 auVar18 [64];
  undefined1 auVar20 [16];
  Vector3<float> VVar21;
  Tuple3<pbrt::Vector3,_float> local_e0;
  optional<pbrt::SquareMatrix<4>_> worldToCamera;
  Tuple3<pbrt::Vector3,_float> local_88;
  Tuple3<pbrt::Vector3,_float> local_78;
  SquareMatrix<4> cameraToWorld;
  
  auVar19 = in_ZMM1._4_60_;
  SquareMatrix<4>::SquareMatrix(&cameraToWorld);
  cameraToWorld.m[0][3] = (pos->super_Tuple3<pbrt::Point3,_float>).x;
  cameraToWorld.m[1][3] = (pos->super_Tuple3<pbrt::Point3,_float>).y;
  cameraToWorld.m[2][3] = (pos->super_Tuple3<pbrt::Point3,_float>).z;
  auVar17 = (undefined1  [56])0x0;
  cameraToWorld.m[3][3] = 1.0;
  VVar21 = Point3<float>::operator-(look,pos);
  worldToCamera.optionalValue._8_4_ = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar17;
  worldToCamera.optionalValue._0_8_ = vmovlps_avx(auVar9._0_16_);
  VVar21 = Normalize<float>((Vector3<float> *)&worldToCamera);
  local_e0.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar17;
  local_e0._0_8_ = vmovlps_avx(auVar10._0_16_);
  VVar21 = Normalize<float>(up);
  worldToCamera.optionalValue._8_4_ = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar17;
  worldToCamera.optionalValue._0_8_ = vmovlps_avx(auVar11._0_16_);
  VVar21 = Cross<float>((Vector3<float> *)&worldToCamera,(Vector3<float> *)&local_e0);
  auVar18._0_4_ = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._4_60_ = auVar19;
  auVar12._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12._8_56_ = auVar17;
  auVar20._0_4_ =
       VVar21.super_Tuple3<pbrt::Vector3,_float>.x * VVar21.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar20._4_4_ =
       VVar21.super_Tuple3<pbrt::Vector3,_float>.y * VVar21.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar20._8_4_ = auVar17._0_4_ * auVar17._0_4_;
  auVar20._12_4_ = auVar17._4_4_ * auVar17._4_4_;
  auVar20 = vmovshdup_avx(auVar20);
  auVar20 = vfmadd231ss_fma(auVar20,auVar12._0_16_,auVar12._0_16_);
  auVar20 = vfmadd231ss_fma(auVar20,auVar18._0_16_,auVar18._0_16_);
  auVar20 = vsqrtss_avx(auVar20,auVar20);
  auVar17 = ZEXT856(auVar20._8_8_);
  if ((auVar20._0_4_ == 0.0) && (!NAN(auVar20._0_4_))) {
    LogFatal<float_const&,float_const&,float_const&,float&,float&,float&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/transform.cpp"
               ,0x5f,
               "LookAt: \"up\" vector (%f, %f, %f) and viewing direction (%f, %f, %f) passed to LookAt are pointing in the same direction."
               ,(float *)up,&(up->super_Tuple3<pbrt::Vector3,_float>).y,
               &(up->super_Tuple3<pbrt::Vector3,_float>).z,&local_e0.x,&local_e0.y,&local_e0.z);
  }
  VVar21 = Normalize<float>(up);
  local_88.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13._8_56_ = auVar17;
  local_88._0_8_ = vmovlps_avx(auVar13._0_16_);
  VVar21 = Cross<float>((Vector3<float> *)&local_88,(Vector3<float> *)&local_e0);
  worldToCamera.optionalValue._8_4_ = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar14._8_56_ = auVar17;
  worldToCamera.optionalValue._0_8_ = vmovlps_avx(auVar14._0_16_);
  VVar21 = Normalize<float>((Vector3<float> *)&worldToCamera);
  local_78.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar15._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar15._8_56_ = auVar17;
  local_78._0_8_ = vmovlps_avx(auVar15._0_16_);
  VVar21 = Cross<float>((Vector3<float> *)&local_e0,(Vector3<float> *)&local_78);
  cameraToWorld.m[2][1] = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar16._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16._8_56_ = auVar17;
  cameraToWorld.m[0][0] = local_78.x;
  cameraToWorld.m[1][0] = local_78.y;
  cameraToWorld.m[2][0] = local_78.z;
  cameraToWorld.m[0][1] = VVar21.super_Tuple3<pbrt::Vector3,_float>.x;
  cameraToWorld.m[1][1] = (Float)vextractps_avx(auVar16._0_16_,1);
  cameraToWorld.m[3][0] = 0.0;
  cameraToWorld.m[3][1] = 0.0;
  cameraToWorld.m[0][2] = local_e0.x;
  cameraToWorld.m[1][2] = local_e0.y;
  cameraToWorld.m[2][2] = local_e0.z;
  cameraToWorld.m[3][2] = 0.0;
  Inverse<4>(&worldToCamera,&cameraToWorld);
  pSVar8 = pstd::optional<pbrt::SquareMatrix<4>_>::value(&worldToCamera);
  uVar1 = *(undefined8 *)(pSVar8->m[0] + 2);
  uVar2 = *(undefined8 *)pSVar8->m[1];
  uVar3 = *(undefined8 *)(pSVar8->m[1] + 2);
  uVar4 = *(undefined8 *)pSVar8->m[2];
  uVar5 = *(undefined8 *)(pSVar8->m[2] + 2);
  uVar6 = *(undefined8 *)pSVar8->m[3];
  uVar7 = *(undefined8 *)(pSVar8->m[3] + 2);
  *(undefined8 *)(__return_storage_ptr__->m).m[0] = *(undefined8 *)pSVar8->m[0];
  *(undefined8 *)((__return_storage_ptr__->m).m[0] + 2) = uVar1;
  *(undefined8 *)(__return_storage_ptr__->m).m[1] = uVar2;
  *(undefined8 *)((__return_storage_ptr__->m).m[1] + 2) = uVar3;
  *(undefined8 *)(__return_storage_ptr__->m).m[2] = uVar4;
  *(undefined8 *)((__return_storage_ptr__->m).m[2] + 2) = uVar5;
  *(undefined8 *)(__return_storage_ptr__->m).m[3] = uVar6;
  *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = uVar7;
  *(ulong *)(__return_storage_ptr__->mInv).m[0] =
       CONCAT44(cameraToWorld.m[0][1],cameraToWorld.m[0][0]);
  *(ulong *)((__return_storage_ptr__->mInv).m[0] + 2) =
       CONCAT44(cameraToWorld.m[0][3],cameraToWorld.m[0][2]);
  *(ulong *)(__return_storage_ptr__->mInv).m[1] =
       CONCAT44(cameraToWorld.m[1][1],cameraToWorld.m[1][0]);
  *(ulong *)((__return_storage_ptr__->mInv).m[1] + 2) =
       CONCAT44(cameraToWorld.m[1][3],cameraToWorld.m[1][2]);
  *(ulong *)(__return_storage_ptr__->mInv).m[2] =
       CONCAT44(cameraToWorld.m[2][1],cameraToWorld.m[2][0]);
  *(ulong *)((__return_storage_ptr__->mInv).m[2] + 2) =
       CONCAT44(cameraToWorld.m[2][3],cameraToWorld.m[2][2]);
  *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = cameraToWorld.m[3]._0_8_;
  *(ulong *)((__return_storage_ptr__->mInv).m[3] + 2) =
       CONCAT44(cameraToWorld.m[3][3],cameraToWorld.m[3][2]);
  pstd::optional<pbrt::SquareMatrix<4>_>::~optional(&worldToCamera);
  return __return_storage_ptr__;
}

Assistant:

Transform LookAt(const Point3f &pos, const Point3f &look, const Vector3f &up) {
    SquareMatrix<4> cameraToWorld;
    // Initialize fourth column of viewing matrix
    cameraToWorld[0][3] = pos.x;
    cameraToWorld[1][3] = pos.y;
    cameraToWorld[2][3] = pos.z;
    cameraToWorld[3][3] = 1;

    // Initialize first three columns of viewing matrix
    Vector3f dir = Normalize(look - pos);
    if (Length(Cross(Normalize(up), dir)) == 0)
        LOG_FATAL("LookAt: \"up\" vector (%f, %f, %f) and viewing direction "
                  "(%f, %f, %f) "
                  "passed to LookAt are pointing in the same direction.",
                  up.x, up.y, up.z, dir.x, dir.y, dir.z);
    Vector3f right = Normalize(Cross(Normalize(up), dir));
    Vector3f newUp = Cross(dir, right);
    cameraToWorld[0][0] = right.x;
    cameraToWorld[1][0] = right.y;
    cameraToWorld[2][0] = right.z;
    cameraToWorld[3][0] = 0.;
    cameraToWorld[0][1] = newUp.x;
    cameraToWorld[1][1] = newUp.y;
    cameraToWorld[2][1] = newUp.z;
    cameraToWorld[3][1] = 0.;
    cameraToWorld[0][2] = dir.x;
    cameraToWorld[1][2] = dir.y;
    cameraToWorld[2][2] = dir.z;
    cameraToWorld[3][2] = 0.;

    pstd::optional<SquareMatrix<4>> worldToCamera = Inverse(cameraToWorld);
#ifndef NDEBUG
    DCHECK(worldToCamera);
#endif  // !NDEBUG
    return Transform(*worldToCamera, cameraToWorld);
}